

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

bool __thiscall
kway_min_id_heap<int,_4,_std::less<int>_>::push_or_set_key
          (kway_min_id_heap<int,_4,_std::less<int>_> *this,int id,key_type key)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  int iVar4;
  
  uVar3 = (ulong)id;
  iVar4 = id + 0x3f;
  if (-1 < id) {
    iVar4 = id;
  }
  if (((this->contained_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
       [(long)(iVar4 >> 6) +
        (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
       (uVar3 & 0x3f) & 1) == 0) {
    push(this,id,key);
  }
  else {
    piVar1 = (this->heap).
             super__Vector_base<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar2 = (this->id_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = piVar2[uVar3];
    if (piVar1[iVar4].key < key) {
      piVar1[iVar4].key = key;
      move_down(this,piVar2[uVar3]);
    }
    else {
      if (piVar1[iVar4].key <= key) {
        return false;
      }
      piVar1[iVar4].key = key;
      move_up(this,piVar2[uVar3]);
    }
  }
  return true;
}

Assistant:

bool push_or_set_key(int id, key_type key)
    {
        assert(0 <= id && id < (int)id_pos.size() && "id is in range");

        check_id_invariants();
        check_order_invariants();

        if (!contains(id)) {
            push(id, key);
            return true;
        } else {
            if (order(heap[id_pos[id]].key, key)) {
                heap[id_pos[id]].key = std::move(key);
                move_down(id_pos[id]);

                check_id_invariants();
                check_order_invariants();

                return true;
            } else if (order(key, heap[id_pos[id]].key)) {
                heap[id_pos[id]].key = std::move(key);
                move_up(id_pos[id]);

                check_id_invariants();
                check_order_invariants();

                return true;
            }
        }
        return false;
    }